

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O1

bool __thiscall mkvmuxer::Tag::add_simple_tag(Tag *this,char *tag_name,char *tag_string)

{
  SimpleTag *dst_ptr;
  SimpleTag *pSVar1;
  int iVar2;
  bool bVar3;
  
  bVar3 = ExpandSimpleTagsArray(this);
  if (bVar3) {
    iVar2 = this->simple_tags_count_;
    this->simple_tags_count_ = iVar2 + 1;
    dst_ptr = this->simple_tags_ + iVar2;
    pSVar1 = this->simple_tags_ + iVar2;
    pSVar1->tag_name_ = (char *)0x0;
    pSVar1->tag_string_ = (char *)0x0;
    bVar3 = anon_unknown_12::StrCpy(tag_name,&dst_ptr->tag_name_);
    if (bVar3) {
      bVar3 = anon_unknown_12::StrCpy(tag_string,&dst_ptr->tag_string_);
      return bVar3;
    }
  }
  return false;
}

Assistant:

bool Tag::add_simple_tag(const char* tag_name, const char* tag_string) {
  if (!ExpandSimpleTagsArray())
    return false;

  SimpleTag& st = simple_tags_[simple_tags_count_++];
  st.Init();

  if (!st.set_tag_name(tag_name))
    return false;

  if (!st.set_tag_string(tag_string))
    return false;

  return true;
}